

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

RAMBlock *
qemu_ram_alloc_from_ptr_aarch64(uc_struct_conflict2 *uc,ram_addr_t size,void *host,MemoryRegion *mr)

{
  anon_struct_8_1_e05e5bab_for_blocks *paVar1;
  uc_struct *uc_00;
  ulong uVar2;
  RAMBlock **ppRVar3;
  RAMBlock *mem;
  RAMBlock *extraout_RAX;
  RAMBlock *pRVar4;
  uint8_t *puVar5;
  ram_addr_t rVar6;
  long lVar7;
  RAMBlock *pRVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  RAMBlock *pRVar13;
  
  if (host == (void *)0x0) {
    size = -uc->qemu_host_page_size & (uc->qemu_host_page_size + size) - 1;
  }
  mem = (RAMBlock *)g_malloc0(0x48);
  if (mem == (RAMBlock *)0x0) {
    return (RAMBlock *)0x0;
  }
  mem->mr = mr;
  mem->used_length = size;
  mem->max_length = size;
  mem->page_size = uc->qemu_real_host_page_size;
  mem->host = (uint8_t *)host;
  if (host != (void *)0x0) {
    *(byte *)&mem->flags = (byte)mem->flags | 1;
  }
  uc->invalid_addr = 0;
  if (size == 0) {
    __assert_fail("size != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                  ,0x3d6,"ram_addr_t find_ram_offset(struct uc_struct *, ram_addr_t)");
  }
  uc_00 = (uc_struct *)mr->uc;
  pRVar4 = (uc_00->ram_list).blocks.lh_first;
  if (pRVar4 == (RAMBlock *)0x0) {
LAB_005d80ad:
    rVar6 = 0;
  }
  else if ((uc_00->ram_list).freed == false) {
    rVar6 = 0;
    pRVar8 = pRVar4;
    do {
      uVar9 = pRVar8->max_length + pRVar8->offset;
      if (rVar6 < uVar9) {
        rVar6 = uVar9;
      }
      pRVar8 = (pRVar8->next).le_next;
    } while (pRVar8 != (RAMBlock *)0x0);
  }
  else {
    lVar7 = 0x40L << ((byte)uc_00->init_target_page->bits & 0x3f);
    uVar9 = 0xffffffffffffffff;
    rVar6 = 0xffffffffffffffff;
    pRVar8 = pRVar4;
    do {
      uVar10 = pRVar8->offset + lVar7 + -1 + pRVar8->max_length & -lVar7;
      uVar11 = 0xffffffffffffffff;
      pRVar13 = pRVar4;
      do {
        uVar2 = pRVar13->offset;
        pRVar13 = (pRVar13->next).le_next;
        uVar12 = uVar2;
        if (uVar11 < uVar2) {
          uVar12 = uVar11;
        }
        if (uVar2 < uVar10) {
          uVar12 = uVar11;
        }
        uVar11 = uVar12;
      } while (pRVar13 != (RAMBlock *)0x0);
      uVar12 = uVar12 - uVar10;
      if (size <= uVar12 && uVar12 < uVar9) {
        uVar9 = uVar12;
        rVar6 = uVar10;
      }
      pRVar8 = (pRVar8->next).le_next;
    } while (pRVar8 != (RAMBlock *)0x0);
    if (rVar6 == 0xffffffffffffffff) {
      qemu_ram_alloc_from_ptr_aarch64_cold_1();
      pRVar4 = extraout_RAX;
      goto LAB_005d80ad;
    }
  }
  paVar1 = &(uc_00->ram_list).blocks;
  mem->offset = rVar6;
  if (host == (void *)0x0) {
    puVar5 = (uint8_t *)qemu_anon_ram_alloc(uc_00,size,&mr->align);
    mem->host = puVar5;
    if (puVar5 == (uint8_t *)0x0) {
      uc_00->invalid_error = 1;
      goto LAB_005d8180;
    }
    pRVar4 = paVar1->lh_first;
  }
  if (pRVar4 == (RAMBlock *)0x0) {
    (mem->next).le_prev = &paVar1->lh_first;
    (mem->next).le_next = (RAMBlock *)0x0;
    paVar1->lh_first = mem;
  }
  else {
    do {
      pRVar8 = pRVar4;
      if (pRVar8->max_length < mem->max_length) {
        ppRVar3 = (pRVar8->next).le_prev;
        (mem->next).le_prev = ppRVar3;
        (mem->next).le_next = pRVar8;
        *ppRVar3 = mem;
        (pRVar8->next).le_prev = &(mem->next).le_next;
        goto LAB_005d8175;
      }
      pRVar4 = (pRVar8->next).le_next;
    } while (pRVar4 != (RAMBlock *)0x0);
    (mem->next).le_next = (RAMBlock *)0x0;
    (mem->next).le_prev = &(pRVar8->next).le_next;
    (pRVar8->next).le_next = mem;
  }
  pRVar4 = (mem->next).le_next;
  if (pRVar4 != (RAMBlock *)0x0) {
    (pRVar4->next).le_prev = &(mem->next).le_next;
  }
LAB_005d8175:
  (uc_00->ram_list).mru_block = (RAMBlock *)0x0;
LAB_005d8180:
  if (uc->invalid_error != 0) {
    g_free(mem);
    return (RAMBlock *)0x0;
  }
  return mem;
}

Assistant:

RAMBlock *qemu_ram_alloc_from_ptr(struct uc_struct *uc, ram_addr_t size, void *host,
                                   MemoryRegion *mr)
{
    RAMBlock *new_block;
    ram_addr_t max_size = size;

    // Don't resize pre-alloced memory as they are given by users.
    if (!host) {
        size = HOST_PAGE_ALIGN(uc, size);
        max_size = HOST_PAGE_ALIGN(uc, max_size);
    }

    new_block = g_malloc0(sizeof(*new_block));
    if (new_block == NULL)
        return NULL;
    new_block->mr = mr;
    new_block->used_length = size;
    new_block->max_length = max_size;
    assert(max_size >= size);
    new_block->page_size = uc->qemu_real_host_page_size;
    new_block->host = host;
    if (host) {
        new_block->flags |= RAM_PREALLOC;
    }

    uc->invalid_addr = UC_ERR_OK;
    ram_block_add(mr->uc, new_block);

    if (uc->invalid_error != UC_ERR_OK) {
        g_free(new_block);
        return NULL;
    }

    return new_block;
}